

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_setup_outgoing_command(ENetPeer *peer,ENetOutgoingCommand *outgoingCommand)

{
  byte bVar1;
  uint16_t uVar2;
  short *psVar3;
  size_t sVar4;
  void *in_RSI;
  long in_RDI;
  ENetChannel *channel;
  
  psVar3 = (short *)(*(long *)(in_RDI + 0x40) + (ulong)*(byte *)((long)in_RSI + 0x29) * 0x50);
  sVar4 = enet_protocol_command_size(*(enet_uint8 *)((long)in_RSI + 0x28));
  *(uint *)(in_RDI + 100) =
       *(int *)(in_RDI + 100) + (int)sVar4 + (uint)*(ushort *)((long)in_RSI + 0x24);
  if (*(char *)((long)in_RSI + 0x29) == -1) {
    *(short *)(in_RDI + 0xdc) = *(short *)(in_RDI + 0xdc) + 1;
    *(undefined2 *)((long)in_RSI + 0x10) = *(undefined2 *)(in_RDI + 0xdc);
    *(undefined2 *)((long)in_RSI + 0x12) = 0;
  }
  else if ((*(byte *)((long)in_RSI + 0x28) & 0x80) == 0) {
    if ((*(byte *)((long)in_RSI + 0x28) & 0x40) == 0) {
      if (*(int *)((long)in_RSI + 0x20) == 0) {
        psVar3[1] = psVar3[1] + 1;
      }
      *(short *)((long)in_RSI + 0x10) = *psVar3;
      *(short *)((long)in_RSI + 0x12) = psVar3[1];
    }
    else {
      *(short *)(in_RDI + 0x146) = *(short *)(in_RDI + 0x146) + 1;
      *(undefined2 *)((long)in_RSI + 0x10) = 0;
      *(undefined2 *)((long)in_RSI + 0x12) = 0;
    }
  }
  else {
    *psVar3 = *psVar3 + 1;
    psVar3[1] = 0;
    *(short *)((long)in_RSI + 0x10) = *psVar3;
    *(undefined2 *)((long)in_RSI + 0x12) = 0;
  }
  *(undefined2 *)((long)in_RSI + 0x26) = 0;
  *(undefined4 *)((long)in_RSI + 0x14) = 0;
  *(undefined4 *)((long)in_RSI + 0x18) = 0;
  *(undefined4 *)((long)in_RSI + 0x1c) = 0;
  uVar2 = htons(*(uint16_t *)((long)in_RSI + 0x10));
  *(uint16_t *)((long)in_RSI + 0x2a) = uVar2;
  bVar1 = *(byte *)((long)in_RSI + 0x28) & 0xf;
  if (bVar1 == 7) {
    uVar2 = htons(*(uint16_t *)((long)in_RSI + 0x12));
    *(uint16_t *)((long)in_RSI + 0x2c) = uVar2;
  }
  else if (bVar1 == 9) {
    uVar2 = htons(*(uint16_t *)(in_RDI + 0x146));
    *(uint16_t *)((long)in_RSI + 0x2c) = uVar2;
  }
  if ((*(byte *)((long)in_RSI + 0x28) & 0x80) == 0) {
    enet_list_insert((ENetListIterator)(in_RDI + 0x120),in_RSI);
  }
  else {
    enet_list_insert((ENetListIterator)(in_RDI + 0x110),in_RSI);
  }
  return;
}

Assistant:

void
enet_peer_setup_outgoing_command (ENetPeer * peer, ENetOutgoingCommand * outgoingCommand)
{
    ENetChannel * channel = & peer -> channels [outgoingCommand -> command.header.channelID];
    
    peer -> outgoingDataTotal += enet_protocol_command_size (outgoingCommand -> command.header.command) + outgoingCommand -> fragmentLength;

    if (outgoingCommand -> command.header.channelID == 0xFF)
    {
       ++ peer -> outgoingReliableSequenceNumber;

       outgoingCommand -> reliableSequenceNumber = peer -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
    {
       ++ channel -> outgoingReliableSequenceNumber;
       channel -> outgoingUnreliableSequenceNumber = 0;

       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED)
    {
       ++ peer -> outgoingUnsequencedGroup;

       outgoingCommand -> reliableSequenceNumber = 0;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    {
       if (outgoingCommand -> fragmentOffset == 0)
         ++ channel -> outgoingUnreliableSequenceNumber;
        
       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = channel -> outgoingUnreliableSequenceNumber;
    }
   
    outgoingCommand -> sendAttempts = 0;
    outgoingCommand -> sentTime = 0;
    outgoingCommand -> roundTripTimeout = 0;
    outgoingCommand -> roundTripTimeoutLimit = 0;
    outgoingCommand -> command.header.reliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> reliableSequenceNumber);

    switch (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK)
    {
    case ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE:
        outgoingCommand -> command.sendUnreliable.unreliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> unreliableSequenceNumber);
        break;

    case ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED:
        outgoingCommand -> command.sendUnsequenced.unsequencedGroup = ENET_HOST_TO_NET_16 (peer -> outgoingUnsequencedGroup);
        break;
    
    default:
        break;
    }

    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
      enet_list_insert (enet_list_end (& peer -> outgoingReliableCommands), outgoingCommand);
    else
      enet_list_insert (enet_list_end (& peer -> outgoingUnreliableCommands), outgoingCommand);
}